

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O3

FEvent * __thiscall FEventTree::GetMinimum(FEventTree *this)

{
  FEventTree *pFVar1;
  FEventTree *pFVar2;
  
  pFVar2 = (FEventTree *)this->Root;
  if (pFVar2 != this) {
    do {
      pFVar1 = pFVar2;
      pFVar2 = (FEventTree *)(pFVar2->Nil).Left;
    } while (pFVar2 != this);
    return &pFVar1->Nil;
  }
  return (FEvent *)0x0;
}

Assistant:

FEvent *FEventTree::GetMinimum ()
{
	FEvent *node = Root;

	if (node == &Nil)
	{
		return NULL;
	}
	while (node->Left != &Nil)
	{
		node = node->Left;
	}
	return node;
}